

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh.c
# Opt level: O3

void Bmc_MeshTest(Gia_Man_t *p,int X,int Y,int T,int fVerbose)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  satoko_t *s;
  Gia_Obj_t *pGVar10;
  abctime aVar11;
  uint uVar12;
  uint uVar13;
  undefined4 in_register_00000014;
  long lVar14;
  abctime time;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int *lits;
  ulong uVar18;
  char *pcVar19;
  timespec *ptVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  int Lit;
  int iGVars [4];
  int iTVars [4];
  int pLits [100];
  int pN [102] [2];
  int Me [102] [102];
  timespec *local_a908;
  uint local_a8fc;
  ulong local_a8e8;
  int local_a8b8;
  int local_a8b4;
  ulong local_a8b0;
  ulong local_a8a8;
  ulong local_a8a0;
  ulong local_a898;
  ulong local_a890;
  ulong local_a888;
  uint local_a880;
  int local_a87c;
  ulong local_a878;
  ulong local_a870;
  ulong local_a868;
  ulong local_a860;
  long local_a858;
  ulong local_a850;
  int local_a848;
  int local_a844;
  int local_a840;
  int local_a83c;
  int local_a838 [4];
  int local_a828 [6];
  ulong local_a810;
  long local_a808;
  ulong local_a800;
  ulong local_a7f8;
  ulong local_a7f0;
  ulong local_a7e8;
  ulong local_a7e0;
  ulong local_a7d8;
  ulong local_a7d0;
  ulong local_a7c8;
  ulong local_a7c0;
  long local_a7b8;
  long local_a7b0;
  long local_a7a8;
  long local_a7a0;
  ulong local_a798;
  long local_a790;
  timespec local_a788 [24];
  int aiStack_a600 [205];
  int iStack_a2cc;
  timespec local_a2c8 [25];
  int local_a12c;
  int local_40;
  int local_3c;
  
  local_a8b0 = CONCAT44(in_register_00000014,Y);
  local_a87c = fVerbose;
  iVar5 = clock_gettime(3,local_a2c8);
  if (iVar5 < 0) {
    local_a858 = -1;
  }
  else {
    local_a858 = local_a2c8[0].tv_nsec / 1000 + local_a2c8[0].tv_sec * 1000000;
  }
  s = satoko_create();
  memset(local_a2c8,0,0xa290);
  memset(aiStack_a600 + 2,0,0x330);
  if (((X < 0x65) && ((int)local_a8b0 < 0x65)) && (T < 0x65)) {
    uVar12 = p->nRegs;
    local_a8a8 = (ulong)uVar12;
    uVar1 = p->nObjs;
    uVar8 = p->vCis->nSize;
    uVar17 = uVar8 - uVar12;
    local_a8a0 = (ulong)uVar17;
    uVar13 = p->vCos->nSize;
    local_a870 = (ulong)uVar13;
    uVar13 = ~(uVar13 + uVar8);
    iVar5 = uVar1 + uVar17 + uVar13;
    if (iVar5 < 0x65) {
      if (0 < (int)uVar17) {
        memset(aiStack_a600 + 2,0xff,(ulong)(~uVar12 + uVar8) * 8 + 8);
      }
      if ((0 < (int)uVar1) && (pGVar10 = p->pObjs, pGVar10 != (Gia_Obj_t *)0x0)) {
        lVar14 = -1;
        do {
          uVar2 = *(undefined8 *)pGVar10;
          uVar12 = (uint)uVar2;
          if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
            aiStack_a600[lVar14 * 2 + 2] = (int)lVar14 - (uVar12 & 0x1fffffff);
            aiStack_a600[lVar14 * 2 + 3] = (int)lVar14 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff)
            ;
          }
          pGVar10 = pGVar10 + 1;
          lVar25 = lVar14 - (ulong)uVar1;
          lVar14 = lVar14 + 1;
        } while (lVar25 != -2);
      }
      iVar7 = (int)local_a8a0;
      local_a808 = (long)iVar7;
      if (local_a87c != 0) {
        printf("The graph has %d inputs: ",local_a8a0 & 0xffffffff);
        if (0 < iVar7) {
          iVar7 = (int)local_a8a8;
          uVar12 = 0x61;
          do {
            printf("%c ",(ulong)uVar12);
            iVar21 = (iVar7 - uVar8) + uVar12;
            uVar12 = uVar12 + 1;
          } while (iVar21 != 0x60);
        }
        printf("  and %d nodes: ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
        lVar14 = local_a808;
        iVar7 = (int)local_a8a0;
        if (iVar7 < iVar5) {
          lVar25 = 0;
          do {
            printf("%c=%c%c ",(ulong)(uint)(iVar7 + 0x61 + (int)lVar25),
                   (ulong)(aiStack_a600[lVar14 * 2 + lVar25 * 2 + 2] + 0x61),
                   (ulong)(aiStack_a600[lVar14 * 2 + lVar25 * 2 + 3] + 0x61));
            lVar25 = lVar25 + 1;
          } while (uVar13 + uVar1 != (int)lVar25);
        }
        putchar(10);
      }
      uVar23 = local_a8b0;
      iVar7 = (int)local_a8b0;
      if (iVar7 < 1) {
        uVar16 = 0;
      }
      else {
        uVar18 = 0;
        ptVar20 = local_a2c8;
        uVar16 = 0;
        do {
          if (0 < X) {
            lVar14 = 0;
            do {
              *(int *)((long)&ptVar20->tv_sec + lVar14) = (int)uVar16;
              lVar14 = lVar14 + 0x198;
              uVar16 = (ulong)((int)uVar16 +
                              ((uVar1 + T) - ((int)local_a8a8 + (int)local_a870)) + 0x10);
            } while ((ulong)(uint)X * 0x198 - lVar14 != 0);
          }
          uVar18 = uVar18 + 1;
          ptVar20 = (timespec *)((long)&ptVar20->tv_sec + 4);
        } while (uVar18 != (local_a8b0 & 0xffffffff));
      }
      local_40 = T;
      local_3c = iVar5;
      if (local_a87c != 0) {
        iVar21 = iVar7 * X;
        printf("SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n"
               ,uVar16,(ulong)(uint)(iVar21 * T),(ulong)(uint)(iVar5 * iVar21),
               (ulong)(uint)(iVar21 * 0x10));
      }
      uVar12 = X - 1;
      local_a880 = iVar7 - 1;
      iVar7 = (int)local_a8a8;
      iVar21 = (int)local_a870;
      local_a898 = (ulong)uVar8;
      if (0 < X) {
        local_a890 = (ulong)local_a880;
        local_a888 = uVar23 & 0xffffffff;
        local_a878 = CONCAT44(local_a878._4_4_,(uVar8 + T) - iVar7);
        uVar23 = 0;
        do {
          if (0 < (int)local_a8b0) {
            uVar16 = 0;
            do {
              iVar26 = *(int *)((long)local_a2c8 + uVar16 * 4 + uVar23 * 0x198);
              if ((uVar23 == 0) || ((uVar16 == 0 || uVar23 == uVar12) || uVar16 == local_a890)) {
                if (0 < T) {
                  iVar15 = iVar26 * 2;
                  iVar24 = 0;
                  do {
                    if (iVar26 < 0) goto LAB_00589075;
                    local_a8b4 = (iVar15 + 1) - (uint)(iVar24 == 0);
                    iVar6 = satoko_add_clause(s,&local_a8b4,1);
                    if (iVar6 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                    ,0xa8,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar24 = iVar24 + 1;
                    iVar15 = iVar15 + 2;
                  } while (T != iVar24);
                }
                if ((int)local_a8a0 < iVar5) {
                  iVar26 = iVar26 + (int)local_a878;
                  iVar24 = iVar26 * 2 + 1;
                  iVar15 = uVar13 + uVar1;
                  do {
                    if (iVar26 < 0) goto LAB_00589075;
                    local_a8b4 = iVar24;
                    iVar6 = satoko_add_clause(s,&local_a8b4,1);
                    if (iVar6 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                    ,0xae,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar24 = iVar24 + 2;
                    iVar26 = iVar26 + 1;
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
              }
              else {
                if (iVar26 < 0) goto LAB_00589075;
                local_a8b4 = iVar26 * 2 + 1;
                iVar26 = satoko_add_clause(s,&local_a8b4,1);
                if (iVar26 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0xb4,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != local_a888);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != (uint)X);
      }
      local_a8b8 = ~(iVar7 + iVar21) + uVar1;
      local_a844 = 1;
      if (1 < T) {
        local_a844 = T;
      }
      local_a7c0 = 1;
      if (1 < (int)local_a880) {
        local_a7c0 = (ulong)local_a880;
      }
      local_a8fc = 0;
      local_a800 = 1;
      if (1 < (int)uVar12) {
        local_a800 = (ulong)uVar12;
      }
      if (1 < (int)uVar12) {
        local_a7c8 = (ulong)(iVar5 + T + 0x10);
        local_a848 = (int)local_a898 * 0xc + (int)local_a8a8 * -0xc;
        local_a7a8 = (long)iVar5;
        local_a840 = -local_a8b8;
        local_a7b0 = (ulong)(uint)T * 2;
        iVar7 = (int)local_a870 + (int)local_a8a8;
        local_a7d8 = (ulong)(uVar1 + T);
        iVar21 = (uVar1 + T) - iVar7;
        local_a7d0 = (ulong)(iVar21 - 1);
        local_a7e8 = (ulong)(iVar7 * -2 + 7);
        local_a7f0 = (ulong)(iVar7 * -2 + 6);
        local_a7f8 = (ulong)(iVar7 * 2 ^ 0xfffffffe);
        local_a7e0 = (ulong)(iVar21 + 3);
        local_a8fc = 0;
        uVar23 = 1;
        do {
          local_a810 = uVar23 + 1;
          if (1 < (int)local_a880) {
            uVar16 = 1;
            local_a7b8 = (long)local_a2c8 + (uVar23 - 1) * 0x198;
            local_a850 = uVar23;
            do {
              uVar8 = *(uint *)((long)local_a2c8 + uVar16 * 4 + uVar23 * 0x198);
              local_a868 = (ulong)uVar8;
              uVar13 = uVar8 + T;
              local_a860 = (ulong)uVar13;
              iVar7 = (int)local_a7c8 + uVar8;
              local_a828[0] = *(int *)(local_a7b8 + uVar16 * 4);
              local_a838[0] = local_a828[0] + T;
              local_a828[1] = (&iStack_a2cc)[uVar23 * 0x66 + uVar16];
              local_a838[1] = (&iStack_a2cc)[uVar23 * 0x66 + uVar16] + T;
              local_a828[2] = *(int *)((long)local_a2c8 + uVar16 * 4 + local_a810 * 0x198);
              local_a838[2] = local_a828[2] + T;
              local_a828[3] = *(int *)((long)local_a2c8 + uVar16 * 4 + uVar23 * 0x198 + 4);
              local_a838[3] = local_a828[3] + T;
              if (iVar5 < 1) {
                if (iVar7 < 0) goto LAB_00589075;
              }
              else {
                iVar26 = uVar13 * 2 + 1;
                iVar21 = 0;
                do {
                  if (((int)uVar13 < 0) || (local_a788[0].tv_sec._0_4_ = iVar26, iVar7 < 0))
                  goto LAB_00589075;
                  local_a788[0].tv_sec._4_4_ = iVar7 * 2;
                  iVar15 = satoko_add_clause(s,(int *)local_a788,2);
                  if (iVar15 == 0) {
                    __assert_fail("RetValue",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                  ,0xd6,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                  }
                  iVar21 = iVar21 + -1;
                  iVar26 = iVar26 + 2;
                  uVar13 = uVar13 + 1;
                } while (local_a840 != iVar21);
                local_a8fc = local_a8fc - iVar21;
                uVar23 = local_a850;
              }
              iVar7 = iVar7 * 2 + 1;
              local_a788[0].tv_sec._0_4_ = iVar7;
              if (1 < T) {
                lVar14 = 2;
                do {
                  if ((int)local_a868 + 1 < 0) goto LAB_00589075;
                  *(int *)((long)&local_a788[0].tv_sec + lVar14 * 2) =
                       (int)local_a868 * 2 + (int)lVar14;
                  lVar14 = lVar14 + 2;
                } while (local_a7b0 != lVar14);
              }
              iVar21 = satoko_add_clause(s,(int *)local_a788,T);
              if (iVar21 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                              ,0xde,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
              }
              uVar16 = uVar16 + 1;
              iVar21 = ((int)local_a7d0 + (int)local_a868) * 2;
              lVar14 = 0;
              do {
                local_a788[0].tv_sec._0_4_ = iVar7;
                if (iVar5 + (int)local_a860 + (int)lVar14 < 0) goto LAB_00589075;
                *(int *)((long)&local_a788[0].tv_sec + lVar14 * 4 + 4) = iVar21;
                lVar14 = lVar14 + 1;
                iVar21 = iVar21 + 2;
              } while (lVar14 != 0x10);
              iVar7 = satoko_add_clause(s,(int *)local_a788,0x11);
              if (iVar7 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                              ,0xe5,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
              }
              local_a8fc = local_a8fc + 2;
              if (1 < T) {
                local_a7a0 = (long)(int)local_a860;
                iVar7 = (int)local_a7d8 + (int)local_a868;
                local_a888 = (ulong)(uint)((int)local_a7f8 + iVar7 * 2) + 1;
                local_a83c = (int)local_a7e8 + iVar7 * 2;
                local_a890 = CONCAT44(local_a890._4_4_,(int)local_a7e0 + (int)local_a868);
                local_a898 = (ulong)(uint)((int)local_a7f0 + iVar7 * 2) + 1;
                iVar7 = 1;
                do {
                  if (0 < iVar5) {
                    if (iVar7 + (int)local_a868 < 0) goto LAB_00589075;
                    iVar21 = (iVar7 + (int)local_a868) * 2 + 1;
                    iVar26 = 0;
                    do {
                      iVar15 = ((int)local_a860 + iVar26) * 2 + 1;
                      local_a8fc = local_a8fc + 8;
                      lVar14 = 0;
                      do {
                        local_a788[0].tv_sec._0_4_ = iVar21;
                        local_a788[0].tv_sec._4_4_ = iVar15;
                        iVar22 = (int)local_a888 + (int)lVar14;
                        local_a788[0].tv_nsec._0_4_ = iVar22;
                        iVar24 = *(int *)((long)local_a828 + lVar14 * 2);
                        iVar6 = iVar24 + iVar7;
                        if (iVar6 == 0 || SCARRY4(iVar24,iVar7) != iVar6 < 0) goto LAB_00589075;
                        local_a788[0].tv_nsec._4_4_ = iVar6 * 2 + -2;
                        iVar24 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar24 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0xf5,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                        }
                        local_a788[0].tv_sec._0_4_ = iVar21;
                        local_a788[0].tv_sec._4_4_ = iVar15;
                        local_a788[0].tv_nsec._0_4_ = iVar22;
                        iVar24 = *(int *)((long)local_a838 + lVar14 * 2) + iVar26;
                        if (iVar24 < 0) goto LAB_00589075;
                        local_a788[0].tv_nsec._4_4_ = iVar24 * 2;
                        iVar24 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar24 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0xfc,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                        }
                        lVar14 = lVar14 + 2;
                      } while (lVar14 != 8);
                      iVar26 = iVar26 + 1;
                    } while (iVar26 != local_a8b8);
                  }
                  if (0 < (int)local_a8a0) {
                    local_a8fc = local_a8fc + local_a848;
                    iVar21 = 0;
                    do {
                      if (iVar21 + (int)local_a860 < 0) goto LAB_00589075;
                      iVar26 = (iVar21 + (int)local_a860) * 2 + 1;
                      iVar24 = 0;
                      iVar15 = local_a83c;
                      do {
                        local_a788[0].tv_sec._0_4_ = iVar26;
                        if ((int)local_a890 + iVar24 < 0) goto LAB_00589075;
                        local_a788[0].tv_sec._4_4_ = iVar15;
                        iVar6 = satoko_add_clause(s,(int *)local_a788,2);
                        if (iVar6 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x105,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        iVar24 = iVar24 + 1;
                        iVar15 = iVar15 + 2;
                      } while (iVar24 != 0xc);
                      iVar21 = iVar21 + 1;
                    } while (iVar21 != (int)local_a8a0);
                  }
                  if ((int)local_a8a0 < iVar5) {
                    uVar8 = (int)local_a868 + iVar7;
                    local_a798 = (ulong)uVar8;
                    iVar21 = uVar8 * 2 + 1;
                    lVar14 = local_a808;
                    do {
                      iVar26 = aiStack_a600[lVar14 * 2 + 2];
                      if (iVar26 < 0) {
LAB_00589568:
                        __assert_fail("pN[g][0] >= 0 && pN[g][1] >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                      ,0x10c,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                      }
                      local_a878 = CONCAT44(local_a878._4_4_,aiStack_a600[lVar14 * 2 + 3]);
                      if (aiStack_a600[lVar14 * 2 + 3] < 0) goto LAB_00589568;
                      if ((int)local_a798 < 0) goto LAB_00589075;
                      local_a790 = lVar14;
                      lVar14 = local_a7a0 + lVar14;
                      local_a8fc = local_a8fc + 0x30;
                      iVar15 = (int)lVar14 * 2 + 1;
                      lVar25 = 0;
                      do {
                        local_a788[0].tv_sec._0_4_ = iVar21;
                        if (lVar14 < 0) goto LAB_00589075;
                        local_a788[0].tv_sec._4_4_ = iVar15;
                        iVar22 = (int)local_a898 + (int)lVar25;
                        local_a788[0].tv_nsec._0_4_ = iVar22;
                        iVar24 = (&DAT_009c5190)[lVar25];
                        iVar6 = local_a828[iVar24] + iVar7;
                        if (iVar6 == 0 || SCARRY4(local_a828[iVar24],iVar7) != iVar6 < 0)
                        goto LAB_00589075;
                        local_a788[0].tv_nsec._4_4_ = iVar6 * 2 + -2;
                        iVar6 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar6 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x113,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788[0].tv_sec._0_4_ = iVar21;
                        local_a788[0].tv_sec._4_4_ = iVar15;
                        local_a788[0].tv_nsec._0_4_ = iVar22;
                        iVar6 = (&DAT_009c5194)[lVar25];
                        iVar9 = local_a828[iVar6] + iVar7;
                        if (iVar9 == 0 || SCARRY4(local_a828[iVar6],iVar7) != iVar9 < 0)
                        goto LAB_00589075;
                        local_a788[0].tv_nsec._4_4_ = iVar9 * 2 + -2;
                        iVar9 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar9 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x11a,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788[0].tv_sec._0_4_ = iVar21;
                        local_a788[0].tv_sec._4_4_ = iVar15;
                        local_a788[0].tv_nsec._0_4_ = iVar22;
                        iVar24 = local_a838[iVar24] + iVar26;
                        if (iVar24 < 0) goto LAB_00589075;
                        local_a788[0].tv_nsec._4_4_ = iVar24 * 2;
                        iVar24 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar24 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x122,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788[0].tv_sec._0_4_ = iVar21;
                        local_a788[0].tv_sec._4_4_ = iVar15;
                        local_a788[0].tv_nsec._0_4_ = iVar22;
                        if (local_a838[iVar6] + (int)local_a878 < 0) goto LAB_00589075;
                        local_a788[0].tv_nsec._4_4_ = (local_a838[iVar6] + (int)local_a878) * 2;
                        iVar24 = satoko_add_clause(s,(int *)local_a788,4);
                        if (iVar24 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                        ,0x129,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        lVar25 = lVar25 + 2;
                      } while (lVar25 != 0x18);
                      lVar14 = local_a790 + 1;
                    } while (lVar14 < local_a7a8);
                  }
                  iVar7 = iVar7 + 1;
                  uVar23 = local_a850;
                } while (iVar7 != local_a844);
              }
            } while (uVar16 != local_a7c0);
          }
          uVar23 = local_a810;
        } while (local_a810 != local_a800);
      }
      local_a12c = local_a12c + iVar5 + T;
      if (local_a12c < 1) {
LAB_00589075:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      local_a8b4 = local_a12c * 2 + -2;
      lits = &local_a8b4;
      iVar7 = satoko_add_clause(s,lits,1);
      if (iVar7 == 0) {
        printf("Problem has no solution. ");
        aVar11 = Abc_Clock();
        Abc_PrintTime((int)aVar11 - (int)local_a858,(char *)lits,time);
      }
      else {
        if (local_a87c != 0) {
          printf("Finished adding %d clauses. Started solving...\n",(ulong)local_a8fc);
        }
        local_a890 = (ulong)local_a880;
        local_a878 = (ulong)(uint)X;
        uVar23 = local_a8b0 & 0xffffffff;
        local_a888 = (ulong)uVar12;
        while( true ) {
          iVar7 = satoko_solve(s);
          local_a898 = CONCAT44(local_a898._4_4_,iVar7);
          if (iVar7 != 1) break;
          if (X < 1) {
LAB_005890ef:
            pcVar19 = "Satisfying solution found. ";
            iVar7 = (int)local_a898;
            goto LAB_00589107;
          }
          uVar16 = 0;
          local_a908 = local_a2c8;
          uVar18 = 0;
          do {
            if (0 < (int)local_a8b0) {
              uVar27 = 0;
              do {
                if ((uVar16 == 0) || ((uVar27 == 0 || uVar16 == local_a888) || local_a890 == uVar27)
                   ) {
                  iVar7 = *(int *)((long)&local_a908->tv_sec + uVar27 * 4) + T;
                  iVar7 = Bmc_MeshAddOneHotness(s,iVar7,iVar7 + iVar5);
                  uVar12 = (int)uVar18 + iVar7;
                }
                else {
                  iVar7 = *(int *)((long)&local_a908->tv_sec + uVar27 * 4);
                  iVar26 = iVar7 + T;
                  iVar7 = Bmc_MeshAddOneHotness(s,iVar7,iVar26);
                  iVar21 = Bmc_MeshAddOneHotness(s,iVar26,iVar5 + iVar26);
                  iVar26 = Bmc_MeshAddOneHotness(s,iVar5 + iVar26,iVar5 + iVar26 + 0x10);
                  uVar12 = iVar26 + iVar21 + iVar7 + (int)uVar18;
                }
                uVar18 = (ulong)uVar12;
                uVar27 = uVar27 + 1;
              } while (uVar23 != uVar27);
            }
            uVar16 = uVar16 + 1;
            local_a908 = (timespec *)&local_a908[0x19].tv_nsec;
          } while (uVar16 != local_a878);
          if ((int)uVar18 < 1) goto LAB_005890ef;
          printf("Adding %d one-hotness clauses.\n",uVar18);
        }
        pcVar19 = "Problem has no solution. ";
        if (iVar7 != -1) {
          if (iVar7 != 0) {
            __assert_fail("status == SATOKO_SAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                          ,0x14f,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
          }
          pcVar19 = "Computation timed out. ";
        }
LAB_00589107:
        printf(pcVar19);
        iVar26 = 3;
        iVar21 = clock_gettime(3,local_a788);
        if (iVar21 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = CONCAT44(local_a788[0].tv_nsec._4_4_,(int)local_a788[0].tv_nsec) / 1000 +
                   CONCAT44(local_a788[0].tv_sec._4_4_,(int)local_a788[0].tv_sec) * 1000000;
        }
        lVar14 = lVar14 - local_a858;
        iVar21 = 0;
        Abc_Print(iVar26,"%s =","Time");
        Abc_Print(iVar26,"%9.2f sec\n",(double)lVar14 / 1000000.0);
        if (iVar7 == 1) {
          uVar12 = 0;
          if (2 < (int)local_a8b0) {
            iVar7 = (int)local_a8a8 + (int)local_a870;
            uVar12 = 0;
            local_a8e8 = 1;
            iVar21 = 0;
            do {
              if (2 < X) {
                uVar16 = 1;
                do {
                  iVar26 = *(int *)((long)local_a2c8 + local_a8e8 * 4 + uVar16 * 0x198);
                  iVar15 = 0;
                  do {
                    cVar4 = satoko_var_polarity(s,iVar15 + iVar5 + T + iVar26);
                    iVar21 = iVar21 + (uint)(cVar4 == '\0');
                    iVar15 = iVar15 + 1;
                  } while (iVar15 != 4);
                  iVar15 = 0;
                  do {
                    cVar4 = satoko_var_polarity(s,iVar15 + iVar26 + ((uVar1 + T) - iVar7) + 3);
                    uVar12 = uVar12 + (cVar4 == '\0');
                    iVar15 = iVar15 + 1;
                  } while (iVar15 != 0xc);
                  uVar16 = uVar16 + 1;
                } while (uVar16 != local_a888);
              }
              local_a8e8 = local_a8e8 + 1;
            } while (local_a8e8 != local_a890);
          }
          iVar7 = (int)local_a8b0;
          printf("The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n"
                 ,X,local_a8b0 & 0xffffffff,(ulong)(uint)T,(ulong)(uVar12 + iVar21),(ulong)uVar12,
                 iVar21);
          printf(" Y\\X ");
          if (0 < X) {
            uVar16 = 0;
            do {
              printf("  %-2d ",uVar16);
              uVar12 = (int)uVar16 + 1;
              uVar16 = (ulong)uVar12;
            } while (X != uVar12);
          }
          putchar(10);
          if (0 < iVar7) {
            uVar16 = 0;
            do {
              printf(" %-2d  ",uVar16 & 0xffffffff);
              if (0 < X) {
                uVar18 = 0;
                do {
                  if (T < 1) {
LAB_005893d5:
                    pcVar19 = "     ";
                    if (uVar18 == local_a888) {
                      pcVar19 = "  *  ";
                    }
                    if (uVar16 == 0) {
                      pcVar19 = "  *  ";
                    }
                    if (uVar16 == local_a890) {
                      pcVar19 = "  *  ";
                    }
                    if (uVar18 == 0) {
                      pcVar19 = "  *  ";
                    }
                    printf(pcVar19);
                  }
                  else {
                    iVar7 = *(int *)((long)local_a2c8 + uVar16 * 4 + uVar18 * 0x198);
                    bVar3 = false;
                    uVar12 = 0;
                    do {
                      if (0 < iVar5) {
                        iVar21 = 0;
                        do {
                          cVar4 = satoko_var_polarity(s,iVar7 + uVar12);
                          if ((cVar4 == '\0') &&
                             (cVar4 = satoko_var_polarity(s,iVar21 + iVar7 + T), cVar4 == '\0')) {
                            printf(" %c%-2d ",(ulong)(iVar21 + 0x61),(ulong)uVar12);
                            bVar3 = true;
                          }
                          iVar21 = iVar21 + 1;
                        } while (local_a8b8 != iVar21);
                      }
                      uVar12 = uVar12 + 1;
                    } while (uVar12 != T);
                    if (!bVar3) goto LAB_005893d5;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != local_a878);
              }
              putchar(10);
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar23);
          }
        }
      }
      satoko_destroy(s);
      return;
    }
  }
  __assert_fail("X <= 100 && Y <= 100 && T <= 100 && G <= 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                ,0x75,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
}

Assistant:

void Bmc_MeshTest( Gia_Man_t * p, int X, int Y, int T, int fVerbose )
{
    abctime clk = Abc_Clock();
    satoko_t * pSat = satoko_create();
    Gia_Obj_t * pObj;
    int Me[102][102] = {{0}};
    int pN[102][2] = {{0}};
    int I = Gia_ManPiNum(p);
    int G = I + Gia_ManAndNum(p);
    int i, x, y, t, g, c, status, RetValue, Lit, iVar, nClauses = 0;

    assert( X <= 100 && Y <= 100 && T <= 100 && G <= 100 );

    // init the graph
    for ( i = 0; i < I; i++ )
        pN[i][0] = pN[i][1] = -1;
    Gia_ManForEachAnd( p, pObj, i )
    {
        pN[i-1][0] = Gia_ObjFaninId0(pObj, i)-1;
        pN[i-1][1] = Gia_ObjFaninId1(pObj, i)-1;
    }
    if ( fVerbose )
    {
        printf( "The graph has %d inputs: ", Gia_ManPiNum(p) );
        for ( i = 0; i < I; i++ )
            printf( "%c ", 'a' + i );
        printf( "  and %d nodes: ", Gia_ManAndNum(p) );
        for ( i = I; i < G; i++ )
            printf( "%c=%c%c ", 'a' + i, 'a' + pN[i][0] , 'a' + pN[i][1] );
        printf( "\n" );
    }

    // init SAT variables (time vars + graph vars + config vars)
    // config variables: 16 = 4 buff vars + 12 node vars
    iVar = 0;
    for ( y = 0; y < Y; y++ )
    for ( x = 0; x < X; x++ )
    {
        //printf( "%3d %3d %3d    %s", iVar, iVar+T, iVar+T+G, x == X-1 ? "\n":"" );
        Me[x][y] = iVar;
        iVar += T + G + NCPARS + 1;
    }
    Me[101][100] = T;
    Me[101][101] = G;
    if ( fVerbose )
        printf( "SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n", iVar, X*Y*T, X*Y*G, X*Y*NCPARS, X*Y );

    // add constraints

    // time 0 and primary inputs only on the boundary
    for ( x = 0; x < X; x++ )
    for ( y = 0; y < Y; y++ )
    {
        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );

        if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
        {
            // time 0 is required
            for ( t = 0; t < T; t++ )
            {
                Lit = Abc_Var2Lit( iTVar+t, (int)(t > 0) );
                RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
            }
            // internal nodes are not allowed
            for ( g = I; g < G; g++ )
            {
                Lit = Abc_Var2Lit( iGVar+g, 1 );
                RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
            }
        }
        else // not a boundary
        {
            Lit = Abc_Var2Lit( iTVar, 1 );  // cannot have time 0
            RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
        }
    }
    for ( x = 1; x < X-1; x++ )
    for ( y = 1; y < Y-1; y++ )
    {
        int pLits[100], nLits;

        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );
        int iCVar = Bmc_MeshCVar( Me, x, y );
        int iUVar = Bmc_MeshUVar( Me, x, y );

        // 0=left  1=up  2=right  3=down
        int iTVars[4]; 
        int iGVars[4];

        iTVars[0] = Bmc_MeshTVar( Me, x-1, y );
        iGVars[0] = Bmc_MeshGVar( Me, x-1, y );

        iTVars[1] = Bmc_MeshTVar( Me, x, y-1 );
        iGVars[1] = Bmc_MeshGVar( Me, x, y-1 );

        iTVars[2] = Bmc_MeshTVar( Me, x+1, y );
        iGVars[2] = Bmc_MeshGVar( Me, x+1, y );

        iTVars[3] = Bmc_MeshTVar( Me, x, y+1 );
        iGVars[3] = Bmc_MeshGVar( Me, x, y+1 );

        // condition when cell is used
        for ( g = 0; g < G; g++ )
        {
            pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
            pLits[1] = Abc_Var2Lit( iUVar, 0 );
            RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
            nClauses++;
        }

        // at least one time is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( t = 1; t < T; t++ )
            pLits[t] = Abc_Var2Lit( iTVar+t, 0 );
        RetValue = satoko_add_clause( pSat, pLits, T );  assert( RetValue );
        nClauses++;

        // at least one config is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( c = 0; c < NCPARS; c++ )
            pLits[c+1] = Abc_Var2Lit( iCVar+c, 0 );
        RetValue = satoko_add_clause( pSat, pLits, NCPARS+1 );  assert( RetValue );
        nClauses++;

        // constraints for each time
        for ( t = 1; t < T; t++ )
        {
            int Conf[12][2] = {{0, 1}, {0, 2}, {0, 3}, {1, 2}, {1, 3}, {2, 3},   {1, 0}, {2, 0}, {3, 0}, {2, 1}, {3, 1}, {3, 2}};
            // buffer
            for ( g = 0; g < G; g++ )
            for ( c = 0; c < 4; c++ )
            {
                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[c]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[c]+g, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nClauses += 2;
            }
            for ( g = 0; g < I; g++ )
            for ( c = 4; c < NCPARS; c++ )
            {
                pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[1] = Abc_Var2Lit( iCVar+c, 1 );
                RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
                nClauses++;
            }
            // node
            for ( g = I; g < G; g++ )
            for ( c = 0; c < 12; c++ )
            {
                assert( pN[g][0] >= 0 && pN[g][1] >= 0 );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][0]]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][1]]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );


                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][0]]+pN[g][0], 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][1]]+pN[g][1], 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nClauses += 4;
            }
        }
    }

    // final condition
    {
        int iGVar = Bmc_MeshGVar( Me, 1, 1 ) + G-1;
        Lit = Abc_Var2Lit( iGVar, 0 );
        RetValue = satoko_add_clause( pSat, &Lit, 1 );  
        if ( RetValue == 0 )
        {
            printf( "Problem has no solution. " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            satoko_destroy( pSat );
            return;
        }
    }

    if ( fVerbose )
        printf( "Finished adding %d clauses. Started solving...\n", nClauses );

    while ( 1 )
    {
        int nAddClauses = 0;
        status = satoko_solve( pSat );
        if ( status == SATOKO_UNSAT )
        {
            printf( "Problem has no solution. " );
            break;
        }
        if ( status == SATOKO_UNDEC )
        {
            printf( "Computation timed out. " );
            break;
        }
        assert( status == SATOKO_SAT );
        // check if the solution is valid and add constraints
        for ( x = 0; x < X; x++ )
        for ( y = 0; y < Y; y++ )
        {
            if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
            {
                int iGVar = Bmc_MeshGVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iGVar, iGVar + G );
            }
            else
            {
                int iTVar = Bmc_MeshTVar( Me, x, y );
                int iGVar = Bmc_MeshGVar( Me, x, y );
                int iCVar = Bmc_MeshCVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iTVar, iTVar + T );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iGVar, iGVar + G );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iCVar, iCVar + NCPARS );
            }
        }
        if ( nAddClauses > 0 )
        {
            printf( "Adding %d one-hotness clauses.\n", nAddClauses );
            continue;
        }
        printf( "Satisfying solution found. " );
/*
        iVar = satoko_varnum(pSat);
        for ( i = 0; i < iVar; i++ )
            if ( Bmc_MeshVarValue(pSat, i) )
                printf( "%d ", i );
        printf( "\n" );
*/
        break;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( status == SATOKO_SAT )
    {
        // count the number of nodes and buffers
        int nBuffs = 0, nNodes = 0;
        for ( y = 1; y < Y-1; y++ )
        for ( x = 1; x < X-1; x++ )
        {
            int iCVar = Bmc_MeshCVar( Me, x, y );
            for ( c = 0; c < 4; c++ )
                if ( Bmc_MeshVarValue(pSat, iCVar+c) )
                {
                    //printf( "Buffer y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nBuffs++;
                }
            for ( c = 4; c < NCPARS; c++ )
                if ( Bmc_MeshVarValue(pSat, iCVar+c) )
                {
                    //printf( "Node   y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nNodes++;
                }
        }
        printf( "The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n", X, Y, T, nNodes+nBuffs, nNodes, nBuffs );
        // print mesh
        printf( " Y\\X " );
        for ( x = 0; x < X; x++ )
            printf( "  %-2d ", x );
        printf( "\n" );
        for ( y = 0; y < Y; y++ )
        {
            printf( " %-2d  ", y );
            for ( x = 0; x < X; x++ )
            {
                int iTVar  = Bmc_MeshTVar( Me, x, y );
                int iGVar  = Bmc_MeshGVar( Me, x, y );

                int fFound = 0;                ;
                for ( t = 0; t < T; t++ )
                for ( g = 0; g < G; g++ )
                    if ( Bmc_MeshVarValue(pSat, iTVar+t) && Bmc_MeshVarValue(pSat, iGVar+g) )
                    {
                        printf( " %c%-2d ", 'a' + g, t );
                        fFound = 1;
                    }
                if ( fFound )
                    continue;
                if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
                    printf( "  *  " );
                else
                    printf( "     " );
            }
            printf( "\n" );
        }
    }
    satoko_destroy( pSat );
}